

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

iterator * __thiscall
immutable::transient_vector<int,_false,_6>::end
          (iterator *__return_storage_ptr__,transient_vector<int,_false,_6> *this)

{
  ref<immutable::transient_rrb<int,_false,_6>_> local_10;
  
  local_10.ptr = (this->_impl).ptr;
  if (local_10.ptr != (transient_rrb<int,_false,_6> *)0x0) {
    (local_10.ptr)->_ref_count = (local_10.ptr)->_ref_count + 1;
  }
  vector_iterator<int,_false,_6>::vector_iterator(__return_storage_ptr__,&local_10);
  ref<immutable::rrb<int,_false,_6>_>::~ref((ref<immutable::rrb<int,_false,_6>_> *)&local_10);
  return __return_storage_ptr__;
}

Assistant:

iterator end() const
        {
        return iterator((const ref<rrb<T, atomic_ref_counting, N>>&)_impl, typename iterator::end_type());
        }